

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_algorithms_tests.hpp
# Opt level: O2

void test_parallel_for_each(void)

{
  undefined4 uVar1;
  undefined8 uVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  uint taskCount;
  ulong uVar8;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  test __t;
  allocator<char> local_43e;
  __allocator_type __a2;
  allocator_type local_43c;
  allocator<char> local_43b;
  allocator<char> local_43a;
  allocator<char> local_439;
  undefined1 local_438 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_418 [2];
  task_base *local_408;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_400;
  uint local_3f4;
  uint local_3f0;
  int local_3ec;
  __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
  local_3e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_3b8 [3];
  atomic<unsigned_long> count;
  undefined4 local_394;
  int local_390;
  int local_38c;
  uint local_388;
  undefined4 local_384;
  undefined4 local_380;
  undefined4 local_37c;
  task_handle local_378;
  shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>_>
  spTaskGroup;
  shared_ptr<oqpi::simple_partitioner> spPartitioner;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  vec;
  undefined8 local_328;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_320;
  string local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_278 [4];
  string local_258 [32];
  string local_238 [32];
  string local_218 [32];
  string local_1f8 [32];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [32];
  string local_178 [32];
  string local_158 [32];
  string local_138 [32];
  string local_118 [32];
  string local_f8 [32];
  string local_d8 [32];
  string local_b8 [32];
  string local_98 [32];
  string local_78 [32];
  string local_58 [40];
  
  test::test(&__t,"test_parallel_for_each");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_298,"Lorem ipsum dolor",(allocator<char> *)&local_3d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)a_Stack_278," sit amet, consectetur",(allocator<char> *)local_438);
  std::__cxx11::string::string<std::allocator<char>>
            (local_258," adipiscing elit.",(allocator<char> *)&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_238,"Nullam nulla sapien,",(allocator<char> *)&local_2d8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_218," mattis a egestas id,",(allocator<char> *)&local_318);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1f8," lobortis ut mauris.",(allocator<char> *)&local_2f8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1d8,"Proin consectetur finibus diam,",(allocator<char> *)&local_394);
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8," eu maximus velit interdum sed.",(allocator<char> *)&spTaskGroup);
  std::__cxx11::string::string<std::allocator<char>>
            (local_198,"Quisque massa nibh, molestie vitae",(allocator<char> *)&spPartitioner);
  std::__cxx11::string::string<std::allocator<char>>
            (local_178," volutpat sed, lacinia non odio.",(allocator<char> *)&local_408);
  std::__cxx11::string::string<std::allocator<char>>
            (local_158,"Aenean dui enim, porttitor quis velit quis,",(allocator<char> *)&local_378);
  std::__cxx11::string::string<std::allocator<char>>
            (local_138," lacinia viverra ex.",(allocator<char> *)&local_328);
  std::__cxx11::string::string<std::allocator<char>>
            (local_118,"Vivamus et libero sit amet orci consequat consectetur.",
             (allocator<char> *)&local_3e8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_f8,"Duis eu porttitor nunc,",(allocator<char> *)&count);
  std::__cxx11::string::string<std::allocator<char>>
            (local_d8," nec scelerisque mi.Cras efficitur lobortis elit, id",
             (allocator<char> *)&__a2);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8," scelerisque diam interdum ut.",&local_43e);
  std::__cxx11::string::string<std::allocator<char>>
            (local_98,"Quisque blandit sodales venenatis.",&local_439);
  std::__cxx11::string::string<std::allocator<char>>
            (local_78,"Ut at purus congue dolor cursus posuere.",&local_43a);
  std::__cxx11::string::string<std::allocator<char>>
            (local_58,"Aliquam ac volutpat turpis, ac placerat nisl.",&local_43b);
  __l._M_len = 0x13;
  __l._M_array = &local_298;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&vec,__l,&local_43c);
  lVar6 = 0x240;
  do {
    std::__cxx11::string::~string((string *)((long)&local_298._M_dataplus._M_p + lVar6));
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x20);
  count.super___atomic_base<unsigned_long>._M_i = (__atomic_base<unsigned_long>)0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_2f8,"FibonacciParallelForEach",&local_43e);
  local_394 = 0;
  uVar7 = (ulong)((long)vec.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vec.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) >> 5;
  iVar5 = (int)uVar7;
  uVar8 = (ulong)(uint)oqpi::
                       helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                       ::scheduler_._32_4_;
  if (iVar5 < (int)oqpi::
                   helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                   ::scheduler_._32_4_) {
    uVar8 = uVar7 & 0xffffffff;
  }
  taskCount = (uint)uVar8;
  if (iVar5 < (int)oqpi::
                   helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                   ::scheduler_._32_4_) {
    local_380 = 0;
    local_384 = 1;
  }
  else {
    uVar7 = (ulong)(uint)(iVar5 >> 0x1f) << 0x20 | uVar7 & 0xffffffff;
    local_384 = (undefined4)((long)uVar7 / (long)(int)taskCount);
    local_380 = (undefined4)((long)uVar7 % (long)(int)taskCount);
  }
  local_37c = 0;
  local_390 = iVar5;
  local_38c = iVar5;
  local_388 = taskCount;
  if (iVar5 < 1) {
    local_3e8._M_ptr = (element_type *)0x0;
    local_3e8._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    std::operator+(&local_3d8,&local_2f8," (");
    std::__cxx11::to_string((string *)local_438,iVar5);
    std::operator+(&local_298,&local_3d8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
    std::operator+(&local_2b8,&local_298," items)");
    std::__cxx11::string::~string((string *)&local_298);
    std::__cxx11::string::~string((string *)local_438);
    std::__cxx11::string::~string((string *)&local_3d8);
    oqpi::
    make_parallel_group<(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::scheduler<concurrent_queue>>
              ((oqpi *)&spTaskGroup,
               (scheduler<concurrent_queue> *)
               oqpi::
               helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
               ::scheduler_,&local_2b8,normal,taskCount,0);
    std::make_shared<oqpi::simple_partitioner,oqpi::simple_partitioner_const&>
              ((simple_partitioner *)&spPartitioner);
    uVar7 = 0;
    if (0 < (int)taskCount) {
      uVar7 = uVar8;
    }
    iVar5 = 0;
    local_3f4 = taskCount;
    while( true ) {
      if ((int)uVar7 == 0) break;
      local_3ec = iVar5 + 1;
      local_3f0 = (int)uVar7 - 1;
      std::__cxx11::to_string((string *)local_438,local_3ec);
      std::operator+(&local_3d8,"Batch ",(string *)local_438);
      std::operator+(&local_298,&local_3d8,"/");
      std::__cxx11::to_string(&local_318,(int)uVar8);
      std::operator+(&local_2d8,&local_298,&local_318);
      std::__cxx11::string::~string((string *)&local_318);
      std::__cxx11::string::~string((string *)&local_298);
      std::__cxx11::string::~string((string *)&local_3d8);
      std::__cxx11::string::~string((string *)local_438);
      local_438._0_4_ = iVar5;
      local_438._8_8_ = &vec;
      local_438._16_8_ = &count;
      std::__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2> *)
                 (local_438 + 0x18),
                 &spPartitioner.
                  super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>);
      _Var3._M_pi = a_Stack_418[0]._M_pi;
      uVar2 = local_438._24_8_;
      local_3d8.field_2._M_allocated_capacity = local_438._16_8_;
      local_3d8._M_dataplus._M_p = (pointer)local_438._0_8_;
      local_3d8._M_string_length = local_438._8_8_;
      local_3d8.field_2._8_8_ = local_438._24_8_;
      a_Stack_3b8[0]._M_pi = a_Stack_418[0]._M_pi;
      local_438._24_8_ = 0;
      a_Stack_418[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_408 = (task_base *)0x0;
      p_Var4 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x70);
      local_318._M_dataplus._M_p = (pointer)&__a2;
      p_Var4->_M_use_count = 1;
      p_Var4->_M_weak_count = 1;
      p_Var4->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00215468;
      local_298.field_2._M_allocated_capacity = local_3d8.field_2._M_allocated_capacity;
      local_298._M_dataplus._M_p = local_3d8._M_dataplus._M_p;
      local_298._M_string_length = local_3d8._M_string_length;
      local_298.field_2._8_8_ = uVar2;
      a_Stack_278[0]._M_pi = _Var3._M_pi;
      local_3d8.field_2._8_8_ = 0;
      a_Stack_3b8[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_base_00215140;
      LOCK();
      UNLOCK();
      uVar1 = oqpi::task_base::uid_provider()::uid_generator._4_4_;
      lVar6 = oqpi::task_base::uid_provider()::uid_generator + 1;
      p_Var4[1]._M_use_count = (undefined4)oqpi::task_base::uid_provider()::uid_generator;
      oqpi::task_base::uid_provider()::uid_generator = lVar6;
      p_Var4[1]._M_weak_count = uVar1;
      p_Var4[2]._vptr__Sp_counted_base = (_func_int **)0x0;
      p_Var4[2]._M_use_count = 0;
      p_Var4[2]._M_weak_count = 0;
      *(undefined2 *)&p_Var4[3]._vptr__Sp_counted_base = 2;
      *(undefined1 *)((long)&p_Var4[3]._vptr__Sp_counted_base + 2) = 0;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002154b8;
      local_318._M_string_length = (size_type)p_Var4;
      timer_task_context::timer_task_context
                ((timer_task_context *)&p_Var4[3]._M_use_count,(task_base *)(p_Var4 + 1),&local_2d8)
      ;
      _Var3._M_pi = a_Stack_278[0]._M_pi;
      p_Var4[1]._vptr__Sp_counted_base = (_func_int **)&PTR__task_002154b8;
      p_Var4[4]._vptr__Sp_counted_base = (_func_int **)local_298._M_dataplus._M_p;
      p_Var4[4]._M_use_count = (undefined4)local_298._M_string_length;
      p_Var4[4]._M_weak_count = local_298._M_string_length._4_4_;
      p_Var4[5]._vptr__Sp_counted_base = (_func_int **)local_298.field_2._M_allocated_capacity;
      a_Stack_278[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var4[5]._M_use_count = local_298.field_2._8_4_;
      p_Var4[5]._M_weak_count = local_298.field_2._12_4_;
      p_Var4[6]._vptr__Sp_counted_base = (_func_int **)_Var3._M_pi;
      local_298.field_2._8_8_ = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_278);
      local_318._M_string_length = 0;
      local_408 = (task_base *)(p_Var4 + 1);
      _Stack_400._M_pi = p_Var4;
      std::
      __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/H-EAL[P]oqpi/include/oqpi/scheduling/task.hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
      ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>,_std::allocator<oqpi::task<(oqpi::task_type)0,_oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,_oqpi::local_sync_object>,_oqpi::context_container<oqpi::task_base,_timer_task_context>,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_H_EAL[P]oqpi_include_oqpi_scheduling_task_hpp:151:18)>_>,_(__gnu_cxx::_Lock_policy)2>_>_>
                          *)&local_318);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_3b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_418);
      local_378.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = _Stack_400._M_pi;
      local_378.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_408;
      local_408 = (task_base *)0x0;
      _Stack_400._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_328 = 0;
      _Stack_320._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      oqpi::
      task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
      ::addTask(&(spTaskGroup.
                  super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr)->
                 super_task_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>
                ,&local_378);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_378.spTask_.super___shared_ptr<oqpi::task_base,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_320);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_400);
      std::__cxx11::string::~string((string *)&local_2d8);
      uVar8 = (ulong)local_3f4;
      uVar7 = (ulong)local_3f0;
      iVar5 = local_3ec;
    }
    local_3e8._M_ptr =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_3e8._M_refcount._M_pi =
         spTaskGroup.
         super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    spTaskGroup.
    super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spPartitioner.
                super___shared_ptr<oqpi::simple_partitioner,_(__gnu_cxx::_Lock_policy)2>._M_refcount
              );
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&spTaskGroup.
                super___shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,_(oqpi::task_type)1,_oqpi::context_container<oqpi::task_group_base,_timer_group_context>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
    std::__cxx11::string::~string((string *)&local_2b8);
    if (local_3e8._M_ptr != (element_type *)0x0) {
      std::__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<oqpi::parallel_group<oqpi::scheduler<concurrent_queue>,(oqpi::task_type)1,oqpi::context_container<oqpi::task_group_base,timer_group_context>>,void>
                ((__shared_ptr<oqpi::task_base,(__gnu_cxx::_Lock_policy)2> *)local_438,&local_3e8);
      local_3d8._M_dataplus._M_p = (pointer)local_438._0_8_;
      local_3d8._M_string_length = local_438._8_8_;
      local_438._0_8_ = (pointer)0x0;
      local_438._8_8_ =
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x0;
      oqpi::scheduler<concurrent_queue>::add
                ((scheduler<concurrent_queue> *)&local_298,
                 (task_handle *)
                 oqpi::
                 helpers<oqpi::scheduler<concurrent_queue>,oqpi::context_container<oqpi::task_group_base,timer_group_context>,oqpi::context_container<oqpi::task_base,timer_task_context>,oqpi::itfc::event<oqpi::posix_event<oqpi::posix_event_manual_reset_policy>,oqpi::local_sync_object>>
                 ::scheduler_);
      oqpi::task_handle::activeWait((task_handle *)&local_298);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_298._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_3d8._M_string_length);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_438 + 8));
    }
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_3e8._M_refcount);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&vec);
  test::~test(&__t);
  return;
}

Assistant:

void test_parallel_for_each()
{
    TEST_FUNC;

    std::vector<std::string> vec
    {
        "Lorem ipsum dolor",
        " sit amet, consectetur",
        " adipiscing elit.",
        "Nullam nulla sapien,",
        " mattis a egestas id,",
        " lobortis ut mauris.",
        "Proin consectetur finibus diam,",
        " eu maximus velit interdum sed.",
        "Quisque massa nibh, molestie vitae",
        " volutpat sed, lacinia non odio.",
        "Aenean dui enim, porttitor quis velit quis,",
        " lacinia viverra ex.",
        "Vivamus et libero sit amet orci consequat consectetur.",
        "Duis eu porttitor nunc,",
        " nec scelerisque mi.Cras efficitur lobortis elit, id",
        " scelerisque diam interdum ut.",
        "Quisque blandit sodales venenatis.",
        "Ut at purus congue dolor cursus posuere.",
        "Aliquam ac volutpat turpis, ac placerat nisl."
    };
    const auto vecSize = int32_t(vec.size());
    std::atomic<uint64_t> count = 0;

    oqpi_tk::parallel_for_each("FibonacciParallelForEach", vec,
        [&count](const std::string &s)
    {
        uint64_t total = 0;
        for (auto c : s)
        {
            total += uint64_t(c) * 100;
        }
        count += fibonacci(total);
    });
}